

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprsprg.cpp
# Opt level: O0

void __thiscall CTcDictEntry::CTcDictEntry(CTcDictEntry *this,CTcSymObj *sym)

{
  void *pvVar1;
  CVmHashFunc *hash_function;
  CVmHashEntry **in_RSI;
  CVmHashTable *in_RDI;
  size_t hash_table_size;
  undefined4 in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  size_t in_stack_ffffffffffffffd0;
  
  in_RDI->table_ = in_RSI;
  *(undefined4 *)&in_RDI->table_size_ = 0;
  in_RDI->hash_function_ = (CVmHashFunc *)0x0;
  pvVar1 = operator_new(in_stack_ffffffffffffffd0,
                        (CTcPrsMem *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  hash_function =
       (CVmHashFunc *)
       operator_new(in_stack_ffffffffffffffd0,
                    (CTcPrsMem *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  memset(hash_function,0,8);
  CVmHashFuncCI::CVmHashFuncCI((CVmHashFuncCI *)hash_function);
  operator_new__((size_t)hash_function,
                 (CTcPrsMem *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  CVmHashTable::CVmHashTable
            (in_RDI,(int)((ulong)pvVar1 >> 0x20),hash_function,in_stack_ffffffffffffffcc,
             (CVmHashEntry **)0x21dc33);
  *(void **)&in_RDI->field_0x18 = pvVar1;
  return;
}

Assistant:

CTcDictEntry::CTcDictEntry(CTcSymObj *sym)
{
    const size_t hash_table_size = 128;

    /* remember my object symbol and word truncation length */
    sym_ = sym;

    /* no object file index yet */
    obj_idx_ = 0;

    /* not in a list yet */
    nxt_ = 0;

    /* create my hash table */
    hashtab_ = new (G_prsmem)
               CVmHashTable(hash_table_size,
                            new (G_prsmem) CVmHashFuncCI(), TRUE,
                            new (G_prsmem) CVmHashEntry *[hash_table_size]);
}